

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O1

int SwapActorTeleFog(AActor *activator,int tid)

{
  long lVar1;
  PClassActor *pPVar2;
  int iVar3;
  PClassActor *temp_1;
  long lVar4;
  long *plVar5;
  
  if (tid == 0) {
    iVar3 = 0;
    if (activator != (AActor *)0x0) {
      pPVar2 = activator->TeleFogSourceType;
      if (pPVar2 != activator->TeleFogDestType) {
        activator->TeleFogSourceType = activator->TeleFogDestType;
        activator->TeleFogDestType = pPVar2;
        iVar3 = 1;
      }
    }
  }
  else {
    iVar3 = 0;
    lVar4 = 0;
    while( true ) {
      plVar5 = (long *)(lVar4 + 0x288);
      if (lVar4 == 0) {
        plVar5 = (long *)((long)AActor::TIDHash + (ulong)((tid & 0x7fU) << 3));
      }
      for (lVar4 = *plVar5; (lVar4 != 0 && (*(int *)(lVar4 + 0x260) != tid));
          lVar4 = *(long *)(lVar4 + 0x288)) {
      }
      if (lVar4 == 0) break;
      lVar1 = *(long *)(lVar4 + 1000);
      if (lVar1 != *(long *)(lVar4 + 0x3f0)) {
        *(long *)(lVar4 + 1000) = *(long *)(lVar4 + 0x3f0);
        *(long *)(lVar4 + 0x3f0) = lVar1;
        iVar3 = iVar3 + 1;
      }
    }
  }
  return iVar3;
}

Assistant:

static int SwapActorTeleFog(AActor *activator, int tid)
{
	int count = 0;
	if (tid == 0)
	{
		if ((activator == NULL) || (activator->TeleFogSourceType == activator->TeleFogDestType)) 
			return 0; //Does nothing if they're the same.

		swapvalues (activator->TeleFogSourceType, activator->TeleFogDestType);
		return 1;
	}
	else
	{
		FActorIterator iterator(tid);
		AActor *actor;
		
		while ((actor = iterator.Next()))
		{
			if (actor->TeleFogSourceType == actor->TeleFogDestType) 
				continue; //They're the same. Save the effort.

			swapvalues (actor->TeleFogSourceType, actor->TeleFogDestType);
			count++;
		}
	}
	return count;
}